

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ScaleLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scale(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0xf5) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0xf5;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    ScaleLayerParams::ScaleLayerParams(this_00.scale_);
    (this->layer_).scale_ = (ScaleLayerParams *)this_00;
  }
  return (ScaleLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ScaleLayerParams* NeuralNetworkLayer::mutable_scale() {
  if (!has_scale()) {
    clear_layer();
    set_has_scale();
    layer_.scale_ = new ::CoreML::Specification::ScaleLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scale)
  return layer_.scale_;
}